

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4_int8.h
# Opt level: O1

void ncnn::im2col_sgemm_pack8to4_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  uint _h;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int *piVar17;
  int nn;
  uint uVar18;
  uint uVar19;
  void *pvVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  undefined1 (*pauVar24) [32];
  ulong uVar25;
  undefined1 (*pauVar26) [16];
  undefined8 *puVar27;
  ulong uVar28;
  long lVar29;
  undefined8 *puVar30;
  long lVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  long lVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  Mat local_88;
  ulong local_38;
  
  uVar2 = bottom_im2col->w;
  uVar22 = (ulong)(int)uVar2;
  iVar3 = bottom_im2col->h;
  _h = bottom_im2col->c;
  uVar21 = (ulong)_h;
  local_38 = (ulong)(uint)top_blob->c;
  local_88.cstep = 0;
  local_88.data = (void *)0x0;
  local_88.refcount._0_4_ = 0;
  local_88.refcount._4_4_ = 0;
  local_88.elemsize = 0;
  local_88.elempack = 0;
  local_88.allocator = (Allocator *)0x0;
  local_88.dims = 0;
  local_88.w = 0;
  local_88.h = 0;
  local_88.d = 0;
  local_88.c = 0;
  if ((long)uVar22 < 4) {
    uVar18 = uVar2;
    iVar32 = iVar3;
    if (1 < (int)uVar2) {
      iVar32 = iVar3 * 2;
      uVar18 = (uVar2 & 1) + 1;
    }
  }
  else {
    uVar18 = (uVar2 & 1) + (uVar2 >> 2) + (uint)((uVar2 >> 1 & 1) != 0);
    iVar32 = iVar3 * 4;
  }
  Mat::create(&local_88,iVar32,_h,uVar18,8,8,opt->workspace_allocator);
  uVar18 = (int)uVar2 >> 2;
  if (0 < (int)uVar18) {
    lVar23 = 0;
    uVar25 = 0;
    do {
      if (0 < (int)_h) {
        puVar27 = (undefined8 *)(local_88.cstep * uVar25 * local_88.elemsize + (long)local_88.data);
        uVar28 = 0;
        do {
          if (0 < iVar3) {
            puVar30 = (undefined8 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar28 + lVar23);
            iVar32 = iVar3;
            do {
              uVar14 = puVar30[1];
              uVar15 = puVar30[2];
              uVar16 = puVar30[3];
              *puVar27 = *puVar30;
              puVar27[1] = uVar14;
              puVar27[2] = uVar15;
              puVar27[3] = uVar16;
              puVar27 = puVar27 + 4;
              puVar30 = puVar30 + uVar22;
              iVar32 = iVar32 + -1;
            } while (iVar32 != 0);
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 != uVar21);
      }
      uVar25 = uVar25 + 1;
      lVar23 = lVar23 + 0x20;
    } while (uVar25 != uVar18);
  }
  uVar19 = uVar2 >> 1 & 1;
  if ((uVar19 != 0) && (0 < (int)_h)) {
    puVar27 = (undefined8 *)
              ((long)(int)uVar18 * local_88.cstep * local_88.elemsize + (long)local_88.data);
    uVar25 = 0;
    do {
      if (0 < iVar3) {
        puVar30 = (undefined8 *)
                  ((long)bottom_im2col->data +
                  bottom_im2col->cstep * bottom_im2col->elemsize * uVar25 +
                  (uVar22 & 0xfffffffffffffffc) * 8);
        iVar32 = iVar3;
        do {
          uVar14 = puVar30[1];
          *puVar27 = *puVar30;
          puVar27[1] = uVar14;
          puVar27 = puVar27 + 2;
          puVar30 = puVar30 + uVar22;
          iVar32 = iVar32 + -1;
        } while (iVar32 != 0);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != uVar21);
  }
  iVar32 = (int)(uVar22 & 0xfffffffffffffffc) + uVar19 * 2;
  if (iVar32 < (int)uVar2) {
    uVar25 = (ulong)iVar32;
    pvVar20 = (void *)(uVar25 * 8 + (long)bottom_im2col->data);
    do {
      if (0 < (int)_h) {
        uVar19 = (uint)uVar25;
        uVar18 = uVar19 + 3;
        if (-1 < (int)uVar19) {
          uVar18 = uVar19;
        }
        puVar27 = (undefined8 *)
                  ((long)(int)((int)(uVar19 - (uVar18 & 0xfffffffc)) / 2 +
                              ((int)uVar18 >> 2) +
                              (uVar19 - (((uint)(uVar25 >> 0x1f) & 1) + uVar19 & 0xfffffffe))) *
                   local_88.cstep * local_88.elemsize + (long)local_88.data);
        uVar28 = 0;
        do {
          if (0 < iVar3) {
            puVar30 = (undefined8 *)
                      (bottom_im2col->cstep * bottom_im2col->elemsize * uVar28 + (long)pvVar20);
            iVar32 = iVar3;
            do {
              *puVar27 = *puVar30;
              puVar27 = puVar27 + 1;
              puVar30 = puVar30 + uVar22;
              iVar32 = iVar32 + -1;
            } while (iVar32 != 0);
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 != uVar21);
      }
      uVar25 = uVar25 + 1;
      pvVar20 = (void *)((long)pvVar20 + 8);
    } while ((long)uVar25 < (long)uVar22);
  }
  if (0 < (int)local_38) {
    iVar32 = _h * iVar3;
    uVar21 = 0;
    auVar8 = vpmovsxbd_avx2(ZEXT816(0xe0b06030f0a0702));
    auVar9 = vpmovsxbd_avx2(ZEXT816(0xc0904010d080500));
    do {
      pauVar24 = (undefined1 (*) [32])
                 (top_blob->cstep * uVar21 * top_blob->elemsize + (long)top_blob->data);
      if ((int)uVar2 < 4) {
        uVar25 = 0;
      }
      else {
        lVar23 = 0;
        uVar28 = 0;
        do {
          if (iVar32 < 1) {
            auVar41 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar43 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar37 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar46 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar40 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar39 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar38 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar36 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            lVar29 = local_88.cstep * local_88.elemsize * lVar23;
            lVar31 = kernel->cstep * uVar21 * kernel->elemsize;
            auVar48 = ZEXT1664((undefined1  [16])0x0);
            lVar35 = 0;
            auVar51 = ZEXT1664((undefined1  [16])0x0);
            auVar50 = ZEXT1664((undefined1  [16])0x0);
            auVar49 = ZEXT1664((undefined1  [16])0x0);
            auVar47 = ZEXT1664((undefined1  [16])0x0);
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            auVar44 = ZEXT1664((undefined1  [16])0x0);
            auVar42 = ZEXT1664((undefined1  [16])0x0);
            iVar33 = iVar32;
            do {
              auVar39 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)local_88.data + lVar35 + lVar29)
                                      );
              auVar37 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)kernel->data + lVar35 + lVar31))
              ;
              auVar41 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)kernel->data + lVar35 + lVar31 + 0x10));
              auVar36 = vpmaddwd_avx2(auVar39,auVar37);
              auVar36 = vpaddd_avx2(auVar36,auVar48._0_32_);
              auVar48 = ZEXT3264(auVar36);
              auVar40 = vpermq_avx2(auVar39,0x4e);
              auVar38 = vpmaddwd_avx2(auVar40,auVar37);
              auVar38 = vpaddd_avx2(auVar38,auVar51._0_32_);
              auVar51 = ZEXT3264(auVar38);
              auVar39 = vpmaddwd_avx2(auVar39,auVar41);
              auVar39 = vpaddd_avx2(auVar39,auVar50._0_32_);
              auVar50 = ZEXT3264(auVar39);
              auVar40 = vpmaddwd_avx2(auVar40,auVar41);
              auVar43 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)local_88.data + lVar35 + lVar29 + 0x10));
              auVar40 = vpaddd_avx2(auVar40,auVar49._0_32_);
              auVar49 = ZEXT3264(auVar40);
              auVar46 = vpmaddwd_avx2(auVar43,auVar37);
              auVar46 = vpaddd_avx2(auVar46,auVar47._0_32_);
              auVar47 = ZEXT3264(auVar46);
              auVar13 = vpermq_avx2(auVar43,0x4e);
              auVar37 = vpmaddwd_avx2(auVar13,auVar37);
              auVar37 = vpaddd_avx2(auVar37,auVar45._0_32_);
              auVar45 = ZEXT3264(auVar37);
              auVar43 = vpmaddwd_avx2(auVar43,auVar41);
              auVar43 = vpaddd_avx2(auVar43,auVar44._0_32_);
              auVar44 = ZEXT3264(auVar43);
              auVar41 = vpmaddwd_avx2(auVar13,auVar41);
              auVar41 = vpaddd_avx2(auVar41,auVar42._0_32_);
              auVar42 = ZEXT3264(auVar41);
              lVar35 = lVar35 + 0x20;
              iVar33 = iVar33 + -1;
            } while (iVar33 != 0);
          }
          auVar13 = vpunpckldq_avx2(auVar36,auVar38);
          auVar10 = vpunpckldq_avx2(auVar39,auVar40);
          auVar38 = vpunpckhdq_avx2(auVar36,auVar38);
          auVar39 = vpunpckhdq_avx2(auVar39,auVar40);
          auVar11 = vpunpckldq_avx2(auVar46,auVar37);
          auVar12 = vpunpckldq_avx2(auVar43,auVar41);
          auVar40 = vpunpckhdq_avx2(auVar46,auVar37);
          auVar46 = vpunpckhdq_avx2(auVar43,auVar41);
          auVar36 = vpermt2d_avx512vl(auVar13,auVar8,auVar10);
          auVar37 = vpermt2d_avx512vl(auVar13,auVar9,auVar10);
          auVar36 = vpaddd_avx2(auVar37,auVar36);
          auVar37 = vpermt2d_avx512vl(auVar38,auVar8,auVar39);
          auVar38 = vpermt2d_avx512vl(auVar38,auVar9,auVar39);
          auVar38 = vpaddd_avx2(auVar37,auVar38);
          auVar36 = vpaddd_avx2(auVar36,auVar38);
          auVar38 = vpermt2d_avx512vl(auVar11,auVar8,auVar12);
          auVar39 = vpermt2d_avx512vl(auVar11,auVar9,auVar12);
          auVar38 = vpaddd_avx2(auVar39,auVar38);
          auVar39 = vpermt2d_avx512vl(auVar40,auVar8,auVar46);
          auVar40 = vpermt2d_avx512vl(auVar40,auVar9,auVar46);
          auVar39 = vpaddd_avx2(auVar39,auVar40);
          auVar38 = vpaddd_avx2(auVar38,auVar39);
          *pauVar24 = auVar36;
          pauVar24[1] = auVar38;
          pauVar24 = pauVar24 + 2;
          uVar25 = uVar28 + 4;
          lVar29 = uVar28 + 7;
          lVar23 = lVar23 + 1;
          uVar28 = uVar25;
        } while (lVar29 < (long)uVar22);
      }
      if ((int)((uint)uVar25 | 1) < (int)uVar2) {
        uVar18 = 0;
        do {
          iVar33 = (int)uVar25;
          if ((int)(_h * iVar3) < 1) {
            auVar36 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar38 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar39 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar40 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            lVar23 = kernel->cstep * uVar21 * kernel->elemsize;
            auVar42 = ZEXT1664((undefined1  [16])0x0);
            lVar29 = 0;
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            auVar47 = ZEXT1664((undefined1  [16])0x0);
            auVar44 = ZEXT1664((undefined1  [16])0x0);
            iVar34 = iVar32;
            do {
              auVar39 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)local_88.data +
                                        lVar29 + local_88.cstep * local_88.elemsize *
                                                 (ulong)((uVar18 & 1) +
                                                        ((uint)(uVar25 >> 2) & 0x3fffffff))));
              auVar38 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)kernel->data + lVar29 * 2 + lVar23));
              auVar40 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)kernel->data + lVar29 * 2 + lVar23 + 0x10));
              auVar36 = vpmaddwd_avx2(auVar39,auVar38);
              auVar36 = vpaddd_avx2(auVar36,auVar44._0_32_);
              auVar44 = ZEXT3264(auVar36);
              auVar46 = vpermq_avx2(auVar39,0x4e);
              auVar38 = vpmaddwd_avx2(auVar46,auVar38);
              auVar38 = vpaddd_avx2(auVar38,auVar47._0_32_);
              auVar47 = ZEXT3264(auVar38);
              auVar39 = vpmaddwd_avx2(auVar40,auVar39);
              auVar39 = vpaddd_avx2(auVar39,auVar45._0_32_);
              auVar45 = ZEXT3264(auVar39);
              auVar40 = vpmaddwd_avx2(auVar46,auVar40);
              auVar40 = vpaddd_avx2(auVar40,auVar42._0_32_);
              auVar42 = ZEXT3264(auVar40);
              lVar29 = lVar29 + 0x10;
              iVar34 = iVar34 + -1;
            } while (iVar34 != 0);
          }
          auVar46 = vpunpckldq_avx2(auVar36,auVar38);
          auVar37 = vpunpckldq_avx2(auVar39,auVar40);
          auVar38 = vpunpckhdq_avx2(auVar36,auVar38);
          auVar39 = vpunpckhdq_avx2(auVar39,auVar40);
          auVar36 = vpermt2d_avx512vl(auVar46,auVar8,auVar37);
          auVar40 = vpermt2d_avx512vl(auVar46,auVar9,auVar37);
          auVar36 = vpaddd_avx2(auVar40,auVar36);
          auVar40 = vpermt2d_avx512vl(auVar38,auVar8,auVar39);
          auVar38 = vpermt2d_avx512vl(auVar38,auVar9,auVar39);
          auVar38 = vpaddd_avx2(auVar40,auVar38);
          auVar36 = vpaddd_avx2(auVar36,auVar38);
          *pauVar24 = auVar36;
          pauVar24 = pauVar24 + 1;
          uVar19 = iVar33 + 2;
          uVar28 = (ulong)uVar19;
          uVar18 = (uint)(byte)((char)uVar18 + 1);
          uVar25 = (ulong)uVar19;
        } while (iVar33 + 3 < (int)uVar2);
      }
      else {
        uVar28 = uVar25 & 0xffffffff;
      }
      if ((int)uVar28 < (int)uVar2) {
        do {
          uVar18 = (uint)uVar28;
          if ((int)(_h * iVar3) < 1) {
            auVar36 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar38 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            pauVar26 = (undefined1 (*) [16])
                       (kernel->cstep * uVar21 * kernel->elemsize + (long)kernel->data);
            auVar42 = ZEXT1664((undefined1  [16])0x0);
            lVar23 = 0;
            auVar44 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar1._8_8_ = 0;
              auVar1._0_8_ = *(ulong *)((long)local_88.data +
                                       lVar23 * 8 +
                                       local_88.cstep * local_88.elemsize *
                                       (ulong)((uVar18 & 1) + (int)(uVar28 >> 2) +
                                              (uint)((uVar18 >> 1 & 1) != 0)));
              auVar1 = vpmovsxbw_avx(auVar1);
              auVar36 = vpmovsxbw_avx2(*pauVar26);
              auVar38 = vpmovsxbw_avx2(pauVar26[1]);
              auVar39._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar1;
              auVar39._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
              auVar36 = vpmaddwd_avx2(auVar39,auVar36);
              auVar36 = vpaddd_avx2(auVar36,auVar44._0_32_);
              auVar44 = ZEXT3264(auVar36);
              auVar38 = vpmaddwd_avx2(auVar39,auVar38);
              auVar38 = vpaddd_avx2(auVar38,auVar42._0_32_);
              auVar42 = ZEXT3264(auVar38);
              pauVar26 = pauVar26 + 2;
              lVar23 = lVar23 + 1;
            } while (iVar32 != (int)lVar23);
          }
          auVar1 = vpunpckldq_avx(auVar36._0_16_,auVar36._16_16_);
          auVar6 = vpunpckldq_avx(auVar38._0_16_,auVar38._16_16_);
          auVar4 = vpunpckhdq_avx(auVar36._0_16_,auVar36._16_16_);
          auVar5 = vpunpckhdq_avx(auVar38._0_16_,auVar38._16_16_);
          auVar7 = vpunpcklqdq_avx(auVar1,auVar6);
          auVar1 = vpunpckhqdq_avx(auVar1,auVar6);
          auVar1 = vpaddd_avx(auVar7,auVar1);
          auVar6 = vpunpcklqdq_avx(auVar4,auVar5);
          auVar4 = vpunpckhqdq_avx(auVar4,auVar5);
          auVar4 = vpaddd_avx(auVar4,auVar6);
          auVar1 = vpaddd_avx(auVar1,auVar4);
          *(undefined1 (*) [16])*pauVar24 = auVar1;
          pauVar24 = (undefined1 (*) [32])(*pauVar24 + 0x10);
          uVar28 = (ulong)(uVar18 + 1);
        } while (uVar18 + 1 != uVar2);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != local_38);
  }
  piVar17 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if (local_88.allocator == (Allocator *)0x0) {
        if (local_88.data != (void *)0x0) {
          free(local_88.data);
        }
      }
      else {
        (*(local_88.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack8to4_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack8to4_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack8to4_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack8to4_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack8to4_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __AVX2__
    if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#else
    if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#endif
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            int64_t* tmpptr = tmp.channel(i / 4);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256i _v = _mm256_loadu_si256((const __m256i*)img0);
                    _mm256_storeu_si256((__m256i*)tmpptr, _v);
                    tmpptr += 4;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = size >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128i _v = _mm_loadu_si128((const __m128i*)img0);
                    _mm_storeu_si128((__m128i*)tmpptr, _v);
                    tmpptr += 2;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr += 1;
                    img0 += size;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();

            __m256i _sum04_15 = _mm256_setzero_si256();
            __m256i _sum14_05 = _mm256_setzero_si256();
            __m256i _sum06_17 = _mm256_setzero_si256();
            __m256i _sum16_07 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_madd_epi16(_val01_16, _w01_16));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_madd_epi16(_val10_16, _w01_16));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_madd_epi16(_val01_16, _w23_16));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_madd_epi16(_val10_16, _w23_16));
#endif

                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);
                __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum04_15 = _mm256_dpwssd_epi32(_sum04_15, _val23_16, _w01_16);
                _sum14_05 = _mm256_dpwssd_epi32(_sum14_05, _val32_16, _w01_16);
                _sum06_17 = _mm256_dpwssd_epi32(_sum06_17, _val23_16, _w23_16);
                _sum16_07 = _mm256_dpwssd_epi32(_sum16_07, _val32_16, _w23_16);
#else
                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_madd_epi16(_val23_16, _w01_16));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_madd_epi16(_val32_16, _w01_16));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_madd_epi16(_val23_16, _w23_16));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_madd_epi16(_val32_16, _w23_16));
#endif

                tmpptr += 32;
                kptr0 += 32;
            }

            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum04_15, _sum14_05);
                _tmp1 = _mm256_unpacklo_epi32(_sum06_17, _sum16_07);
                _tmp2 = _mm256_unpackhi_epi32(_sum04_15, _sum14_05);
                _tmp3 = _mm256_unpackhi_epi32(_sum06_17, _sum16_07);
                _sum04_15 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum14_05 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum06_17 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum16_07 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum14_05);
            _sum06_17 = _mm256_add_epi32(_sum06_17, _sum16_07);
            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum06_17);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);
            _sum04_15 = _mm256_permutevar8x32_epi32(_sum04_15, _perm_mask);

            _mm256_storeu_si256((__m256i*)outptr0, _sum00_11);
            _mm256_storeu_si256((__m256i*)(outptr0 + 8), _sum04_15);
            outptr0 += 16;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum01 = _mm_setzero_si128();
            __m128i _sum02 = _mm_setzero_si128();
            __m128i _sum03 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
            __m128i _sum11 = _mm_setzero_si128();
            __m128i _sum12 = _mm_setzero_si128();
            __m128i _sum13 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_madd_epi16(_val01_16, _w01_16));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_madd_epi16(_val10_16, _w01_16));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_madd_epi16(_val01_16, _w23_16));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_madd_epi16(_val10_16, _w23_16));
#endif
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                _sum02 = _mm_maddd_epi16(_val0, _w2, _sum02);
                _sum03 = _mm_maddd_epi16(_val0, _w3, _sum03);
                _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
                _sum12 = _mm_maddd_epi16(_val1, _w2, _sum12);
                _sum13 = _mm_maddd_epi16(_val1, _w3, _sum13);
#else
                _sum00 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum00);
                _sum01 = _mm_add_epi32(_mm_madd_epi16(_val0, _w1), _sum01);
                _sum02 = _mm_add_epi32(_mm_madd_epi16(_val0, _w2), _sum02);
                _sum03 = _mm_add_epi32(_mm_madd_epi16(_val0, _w3), _sum03);
                _sum10 = _mm_add_epi32(_mm_madd_epi16(_val1, _w0), _sum10);
                _sum11 = _mm_add_epi32(_mm_madd_epi16(_val1, _w1), _sum11);
                _sum12 = _mm_add_epi32(_mm_madd_epi16(_val1, _w2), _sum12);
                _sum13 = _mm_add_epi32(_mm_madd_epi16(_val1, _w3), _sum13);
#endif
#endif

                tmpptr += 16;
                kptr0 += 32;
            }

#if __AVX2__
            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);

            _mm256_storeu_si256((__m256i*)outptr0, _sum00_11);
#else
            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00 = _mm_add_epi32(_sum00, _sum01);
            _sum02 = _mm_add_epi32(_sum02, _sum03);
            _sum10 = _mm_add_epi32(_sum10, _sum11);
            _sum12 = _mm_add_epi32(_sum12, _sum13);

            _sum00 = _mm_add_epi32(_sum00, _sum02);
            _sum10 = _mm_add_epi32(_sum10, _sum12);

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
#endif
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum0_1 = _mm256_setzero_si256();
            __m256i _sum2_3 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                _val = _mm_cvtepi8_epi16(_val);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _valval = _mm256_inserti128_si256(_mm256_castsi128_si256(_val), _val, 1);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum0_1 = _mm256_dpwssd_epi32(_sum0_1, _valval, _w01_16);
                _sum2_3 = _mm256_dpwssd_epi32(_sum2_3, _valval, _w23_16);
#else
                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_madd_epi16(_valval, _w01_16));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_madd_epi16(_valval, _w23_16));
#endif
#else
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val = _mm_cvtepi8_epi16(_val);
#else
                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));
#endif

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val, _w0, _sum0);
                _sum1 = _mm_maddd_epi16(_val, _w1, _sum1);
                _sum2 = _mm_maddd_epi16(_val, _w2, _sum2);
                _sum3 = _mm_maddd_epi16(_val, _w3, _sum3);
#else
                _sum0 = _mm_add_epi32(_mm_madd_epi16(_val, _w0), _sum0);
                _sum1 = _mm_add_epi32(_mm_madd_epi16(_val, _w1), _sum1);
                _sum2 = _mm_add_epi32(_mm_madd_epi16(_val, _w2), _sum2);
                _sum3 = _mm_add_epi32(_mm_madd_epi16(_val, _w3), _sum3);
#endif
#endif

                tmpptr += 8;
                kptr0 += 32;
            }

#if __AVX2__
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_1, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum0_1, 1);
            __m128i _sum2 = _mm256_extracti128_si256(_sum2_3, 0);
            __m128i _sum3 = _mm256_extracti128_si256(_sum2_3, 1);
#endif

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);

            _sum0 = _mm_add_epi32(_sum0, _sum2);

            _mm_storeu_si128((__m128i*)outptr0, _sum0);
            outptr0 += 4;
        }
    }
}